

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O1

void __thiscall
Fl_Preferences::Fl_Preferences(Fl_Preferences *this,Fl_Preferences *parent,char *group)

{
  Fl_Preferences *pFVar1;
  Node *pNVar2;
  char *pcVar3;
  RootNode *pRVar4;
  byte bVar5;
  
  this->_vptr_Fl_Preferences = (_func_int **)&PTR__Fl_Plugin_Manager_00278cb8;
  if ((parent == (Fl_Preferences *)0x0) &&
     (parent = runtimePrefs, runtimePrefs == (Fl_Preferences *)0x0)) {
    pFVar1 = (Fl_Preferences *)operator_new(0x18);
    pFVar1->_vptr_Fl_Preferences = (_func_int **)&PTR__Fl_Plugin_Manager_00278cb8;
    pFVar1->node = (Node *)0x0;
    pFVar1->rootNode = (RootNode *)0x0;
    runtimePrefs = pFVar1;
    pNVar2 = (Node *)operator_new(0x48);
    pcVar3 = strdup(".");
    pNVar2->path_ = pcVar3;
    pNVar2->child_ = (Node *)0x0;
    pNVar2->next_ = (Node *)0x0;
    (pNVar2->field_2).parent_ = (Node *)0x0;
    pNVar2->entry_ = (Entry *)0x0;
    pNVar2->nEntry_ = 0;
    pNVar2->NEntry_ = 0;
    bVar5 = pNVar2->field_0x30 & 0xf8;
    pNVar2->field_0x30 = bVar5;
    pNVar2->index_ = (Node **)0x0;
    pNVar2->nIndex_ = 0;
    pNVar2->NIndex_ = 0;
    pFVar1->node = pNVar2;
    pRVar4 = (RootNode *)operator_new(0x20);
    pRVar4->prefs_ = pFVar1;
    pRVar4->filename_ = (char *)0x0;
    pRVar4->vendor_ = (char *)0x0;
    pRVar4->application_ = (char *)0x0;
    pFVar1->rootNode = pRVar4;
    pNVar2->field_2 = (anon_union_8_2_d68c4589_for_Node_2)this->rootNode;
    pNVar2->field_0x30 = bVar5 | 2;
    parent = runtimePrefs;
  }
  this->rootNode = parent->rootNode;
  pNVar2 = Node::addChild(parent->node,group);
  this->node = pNVar2;
  return;
}

Assistant:

Fl_Preferences::Fl_Preferences( Fl_Preferences *parent, const char *group ) {
  if (parent==0) {
    if (!runtimePrefs) {
      runtimePrefs = new Fl_Preferences();
      runtimePrefs->node = new Node( "." );
      runtimePrefs->rootNode = new RootNode( runtimePrefs );
      runtimePrefs->node->setRoot(rootNode);
    }
    parent = runtimePrefs;
  }
  rootNode = parent->rootNode;
  node = parent->node->addChild( group );
}